

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall Instance::computeCollisionConstraint(Instance *this,Train *train)

{
  pointer pvVar1;
  int iVar2;
  bool bVar3;
  size_t startIndex;
  size_t sVar4;
  size_t sVar5;
  pointer otherTrain;
  pathType path;
  expr_vector otherPathVars;
  expr endVar;
  expr startVar;
  expr_vector otherTrainPosVars;
  ulong local_108;
  _Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_> local_f0;
  ast_vector_tpl<z3::expr> local_d8;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_c8;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_c0;
  Graph *local_b8;
  ulong local_b0;
  vector<z3::expr,_std::allocator<z3::expr>_> *local_a8;
  Train *local_a0;
  pointer local_98;
  ast local_90;
  ast local_80;
  ast local_70;
  ast local_60;
  ast_vector_tpl<z3::expr> local_50;
  ast local_40;
  
  pvVar1 = (this->trainPaths).
           super__Vector_base<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = *(pointer *)
              ((long)&pvVar1[train->id].
                      super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
  local_b8 = &this->graph;
  local_a8 = &this->constraints;
  local_a0 = train;
  for (local_c0 = pvVar1[train->id].
                  super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_c0 != local_c8;
      local_c0 = local_c0 + 1) {
    std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector
              ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)&local_f0,local_c0);
    z3::ast_vector_tpl<z3::expr>::ast_vector_tpl(&local_50,this->c);
    for (startIndex = 0;
        startIndex <
        (ulong)((long)local_f0._M_impl.super__Vector_impl_data._M_finish -
                (long)local_f0._M_impl.super__Vector_impl_data._M_start >> 3);
        startIndex = startIndex + 1) {
      local_b0 = Graph::reachableInPath(local_b8,(pathType *)&local_f0,startIndex,train->speed);
      for (sVar4 = startIndex; sVar4 <= local_b0; sVar4 = sVar4 + 1) {
        local_108 = (ulong)(train->start).arrivalTime;
        while (local_108 < this->maxTimeSteps - 1) {
          z3::ast_vector_tpl<z3::expr>::ast_vector_tpl(&local_d8,this->c);
          local_98 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          for (otherTrain = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl
                            .super__Vector_impl_data._M_start; iVar2 = (int)(local_108 << 4),
              otherTrain != local_98; otherTrain = otherTrain + 1) {
            bVar3 = Train::operator==(train,otherTrain);
            sVar5 = startIndex;
            if (!bVar3 && (otherTrain->start).arrivalTime <= local_108) {
              for (; sVar5 <= sVar4; sVar5 = sVar5 + 1) {
                z3::ast_vector_tpl<z3::expr>::operator[]
                          ((ast_vector_tpl<z3::expr> *)&local_80,
                           (int)(this->occupiedVars).
                                super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[otherTrain->id].
                                super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar2);
                z3::operator!((z3 *)&local_70,(expr *)&local_80);
                z3::ast_vector_tpl<z3::expr>::push_back(&local_d8,(expr *)&local_70);
                z3::ast::~ast(&local_70);
                z3::ast::~ast(&local_80);
                z3::ast_vector_tpl<z3::expr>::operator[]
                          ((ast_vector_tpl<z3::expr> *)&local_80,
                           (int)(this->occupiedVars).
                                super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[otherTrain->id].
                                super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x10 + iVar2);
                z3::operator!((z3 *)&local_70,(expr *)&local_80);
                z3::ast_vector_tpl<z3::expr>::push_back(&local_d8,(expr *)&local_70);
                z3::ast::~ast(&local_70);
                z3::ast::~ast(&local_80);
              }
            }
            train = local_a0;
          }
          z3::ast_vector_tpl<z3::expr>::operator[]
                    ((ast_vector_tpl<z3::expr> *)&local_70,
                     iVar2 + (int)(this->occupiedVars).
                                  super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[train->id].
                                  super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          local_108 = local_108 + 1;
          z3::ast_vector_tpl<z3::expr>::operator[]
                    ((ast_vector_tpl<z3::expr> *)&local_80,
                     (int)local_108 * 0x10 +
                     (int)(this->occupiedVars).
                          super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[train->id].
                          super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          z3::operator&&((z3 *)&local_90,(expr *)&local_70,(expr *)&local_80);
          z3::mk_and((z3 *)&local_60,&local_d8);
          z3::implies((z3 *)&local_40,(expr *)&local_90,(expr *)&local_60);
          std::vector<z3::expr,_std::allocator<z3::expr>_>::emplace_back<z3::expr>
                    (local_a8,(expr *)&local_40);
          z3::ast::~ast(&local_40);
          z3::ast::~ast(&local_60);
          z3::ast::~ast(&local_90);
          z3::ast::~ast(&local_80);
          z3::ast::~ast(&local_70);
          z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(&local_d8);
        }
      }
    }
    z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl(&local_50);
    std::_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>::~_Vector_base(&local_f0);
  }
  return;
}

Assistant:

void Instance::computeCollisionConstraint(const Train &train) {
  for (pathType path : trainPaths[train.id]) {
    expr_vector otherTrainPosVars(*c);
    for (size_t startIndex = 0; startIndex < path.size(); startIndex++) {
      size_t endIndex = graph.reachableInPath(path, startIndex, train.speed);
      for (size_t pathIndex = startIndex; pathIndex <= endIndex; pathIndex++) {

        for (size_t time = train.start.arrivalTime; time < maxTimeSteps - 1;
             time++) {
          expr_vector otherPathVars(*c);

          for (const Train &otherTrain : trains) {
            if (train == otherTrain || otherTrain.start.arrivalTime > time)
              continue;
            for (size_t betweenIndex = startIndex; betweenIndex <= pathIndex;
                 betweenIndex++) {

              otherPathVars.push_back(
                  !occupiedVars[otherTrain.id][time][path[betweenIndex]->id]);
              otherPathVars.push_back(!occupiedVars[otherTrain.id][time + 1]
                                                   [path[betweenIndex]->id]);
            }
          }

          expr startVar = occupiedVars[train.id][time][path[startIndex]->id];
          expr endVar = occupiedVars[train.id][time + 1][path[pathIndex]->id];
          constraints.push_back(
              implies(startVar && endVar, mk_and(otherPathVars)));
        }
      }
    }
  }
}